

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int DoJumpIfCloser(AActor *target,VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,
                  int numret)

{
  double dVar1;
  AActor *this;
  void *val;
  bool bVar2;
  double dVar3;
  double dVar4;
  bool local_7b;
  FState *state_2;
  FState *state_1;
  FState *state;
  bool noz;
  FState *jump;
  double dist;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  AActor *target_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4db,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4db,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_7b = true;
  if (this != (AActor *)0x0) {
    local_7b = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4db,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dc,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dc,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  dVar1 = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dd,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if ((param[2].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[2].field_0.field_1.atag != 7)) {
    bVar2 = param[2].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dd,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  val = param[2].field_0.field_1.a;
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    bVar2 = false;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4de,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    bVar2 = param[3].field_0.i != 0;
  }
  if (target == (AActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret != (VMReturn *)0x0) {
      VMReturn::SetPointer(ret,(void *)0x0,7);
      return 1;
    }
    __assert_fail("ret != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4e2,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  dVar3 = AActor::Distance2D(this,target,false);
  if (dVar3 < dVar1) {
    if (bVar2) {
LAB_0088a497:
      if (numret < 1) {
        return 0;
      }
      if (ret != (VMReturn *)0x0) {
        VMReturn::SetPointer(ret,val,7);
        return 1;
      }
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4e9,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    dVar3 = AActor::Z(this);
    dVar4 = AActor::Z(target);
    if (dVar4 < dVar3) {
      dVar3 = AActor::Z(this);
      dVar4 = AActor::Top(target);
      if (dVar3 - dVar4 < dVar1) goto LAB_0088a497;
    }
    dVar3 = AActor::Z(this);
    dVar4 = AActor::Z(target);
    if (dVar3 <= dVar4) {
      dVar3 = AActor::Z(target);
      dVar4 = AActor::Top(this);
      if (dVar3 - dVar4 < dVar1) goto LAB_0088a497;
    }
  }
  if (numret < 1) {
    target_local._4_4_ = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4eb,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
    VMReturn::SetPointer(ret,(void *)0x0,7);
    target_local._4_4_ = 1;
  }
  return target_local._4_4_;
}

Assistant:

static int DoJumpIfCloser(AActor *target, VM_ARGS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT	(dist);
	PARAM_STATE	(jump);
	PARAM_BOOL_OPT(noz) { noz = false; }

	if (!target)
	{ // No target - no jump
		ACTION_RETURN_STATE(NULL);
	}
	if (self->Distance2D(target) < dist &&
		(noz || 
		((self->Z() > target->Z() && self->Z() - target->Top() < dist) ||
		(self->Z() <= target->Z() && target->Z() - self->Top() < dist))))
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}